

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_client.cc
# Opt level: O0

ssl_hs_wait_t bssl::do_early_reverify_server_certificate(SSL_HANDSHAKE *hs)

{
  Span<const_unsigned_char> traffic_secret;
  SSL *hs_00;
  bool bVar1;
  ssl_verify_result_t sVar2;
  pointer psVar3;
  pointer psVar4;
  uchar *in_stack_ffffffffffffffa8;
  SSL_PROTOCOL_METHOD *this;
  SSL_SESSION *local_30 [2];
  SSL *local_20;
  SSL *ssl;
  SSL_HANDSHAKE *hs_local;
  
  local_20 = hs->ssl;
  ssl = (SSL *)hs;
  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&local_20->ctx);
  if (((psVar3->reverify_on_resume & 1U) != 0) &&
     (sVar2 = ssl_reverify_peer_cert((SSL_HANDSHAKE *)ssl,false), sVar2 != ssl_verify_ok)) {
    if (sVar2 == ssl_verify_invalid) {
      return ssl_hs_error;
    }
    if (sVar2 == ssl_verify_retry) {
      *(undefined4 *)&ssl->field_0x14 = 2;
      return ssl_hs_certificate_verify;
    }
  }
  bVar1 = (*local_20->method->add_change_cipher_spec)(local_20);
  hs_00 = ssl;
  if (bVar1) {
    psVar4 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)(ssl + 10));
    bVar1 = tls13_init_early_key_schedule((SSL_HANDSHAKE *)hs_00,psVar4);
    if ((bVar1) && (bVar1 = tls13_derive_early_secret((SSL_HANDSHAKE *)ssl), bVar1)) {
      this = ssl->method;
      psVar4 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)(ssl + 10));
      Span<unsigned_char_const>::
      Span<bssl::InplaceVector<unsigned_char,64ul>,void,bssl::InplaceVector<unsigned_char,64ul>>
                ((Span<unsigned_char_const> *)local_30,
                 (InplaceVector<unsigned_char,_64UL> *)((long)&ssl->info_callback + 1));
      traffic_secret.size_ = (size_t)this;
      traffic_secret.data_ = in_stack_ffffffffffffffa8;
      bVar1 = tls13_set_traffic_key
                        ((bssl *)this,(SSL *)0x1,ssl_encryption_early_data,
                         (evp_aead_direction_t)psVar4,local_30[0],traffic_secret);
      if (bVar1) {
        *(uint *)&ssl[10].d1 = *(uint *)&ssl[10].d1 & 0xfffffbff | 0x400;
        *(uint *)&ssl[10].d1 = *(uint *)&ssl[10].d1 & 0xffffdfff | 0x2000;
        *(undefined4 *)&ssl->field_0x14 = 3;
        return ssl_hs_early_return;
      }
    }
  }
  return ssl_hs_error;
}

Assistant:

static enum ssl_hs_wait_t do_early_reverify_server_certificate(
    SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  if (ssl->ctx->reverify_on_resume) {
    // Don't send an alert on error. The alert would be in the clear, which the
    // server is not expecting anyway. Alerts in between ClientHello and
    // ServerHello cannot usefully be delivered in TLS 1.3.
    //
    // TODO(davidben): The client behavior should be to verify the certificate
    // before deciding whether to offer the session and, if invalid, decline to
    // send the session.
    switch (ssl_reverify_peer_cert(hs, /*send_alert=*/false)) {
      case ssl_verify_ok:
        break;
      case ssl_verify_invalid:
        return ssl_hs_error;
      case ssl_verify_retry:
        hs->state = state_early_reverify_server_certificate;
        return ssl_hs_certificate_verify;
    }
  }

  if (!ssl->method->add_change_cipher_spec(ssl)) {
    return ssl_hs_error;
  }

  // Defer releasing the 0-RTT key to after certificate reverification, so the
  // QUIC implementation does not accidentally write data too early.
  if (!tls13_init_early_key_schedule(hs, hs->early_session.get()) ||
      !tls13_derive_early_secret(hs) ||
      !tls13_set_traffic_key(hs->ssl, ssl_encryption_early_data, evp_aead_seal,
                             hs->early_session.get(),
                             hs->early_traffic_secret)) {
    return ssl_hs_error;
  }

  hs->in_early_data = true;
  hs->can_early_write = true;
  hs->state = state_read_server_hello;
  return ssl_hs_early_return;
}